

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall sznet::net::Socket::setReusePort(Socket *this,bool on)

{
  LogStream *this_00;
  SourceFile file;
  undefined1 local_1000 [12];
  Logger local_ff0;
  int local_1c;
  uint local_18;
  int ret;
  int optval;
  bool on_local;
  Socket *this_local;
  
  local_18 = (uint)on;
  ret._3_1_ = on;
  _optval = this;
  local_1c = setsockopt(this->m_sockfd,1,0xf,&local_18,4);
  if ((local_1c < 0) && ((ret._3_1_ & 1) != 0)) {
    Logger::SourceFile::SourceFile<97>
              ((SourceFile *)local_1000,
               (char (*) [97])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Socket.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_1000._0_8_;
    file.m_size = local_1000._8_4_;
    Logger::Logger(&local_ff0,file,0x47,false);
    this_00 = Logger::stream(&local_ff0);
    LogStream::operator<<(this_00,"SO_REUSEPORT failed.");
    Logger::~Logger(&local_ff0);
  }
  return;
}

Assistant:

void Socket::setReusePort(bool on)
{
#ifdef SO_REUSEPORT
	int optval = on ? 1 : 0;
	int ret = ::setsockopt(m_sockfd, SOL_SOCKET, SO_REUSEPORT, &optval, static_cast<socklen_t>(sizeof optval));
	if (ret < 0 && on)
	{
		LOG_SYSERR << "SO_REUSEPORT failed.";
	}
#else
	if (on)
	{
		LOG_ERROR << "SO_REUSEPORT is not supported.";
	}
#endif
}